

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateContinue(ExpressionTranslateContext *ctx,ExprContinue *expression)

{
  ExprBase *expression_00;
  uint *puVar1;
  
  expression_00 = expression->closures;
  if (((expression_00 != (ExprBase *)0x0) && (expression_00->typeID == 0x37)) &&
     (expression_00[1].typeID != 0)) {
    Translate(ctx,expression_00);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
  }
  puVar1 = SmallArray<unsigned_int,_32U>::operator[]
                     (&ctx->loopContinueIdStack,
                      (ctx->loopContinueIdStack).count -
                      *(int *)&(expression->super_ExprBase).field_0x2c);
  Print(ctx,"goto continue_%d;",(ulong)*puVar1);
  return;
}

Assistant:

void TranslateContinue(ExpressionTranslateContext &ctx, ExprContinue *expression)
{
	if(ExprSequence *closures = getType<ExprSequence>(expression->closures))
	{
		if(!closures->expressions.empty())
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}
	}

	Print(ctx, "goto continue_%d;", ctx.loopContinueIdStack[ctx.loopContinueIdStack.size() - expression->depth]);
}